

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hospital.cpp
# Opt level: O0

vector<int,_std::allocator<int>_> * __thiscall
Hospital::Find_Doctor_From_His_Field_vector
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,Hospital *this,
          vector<Doctor,_std::allocator<Doctor>_> *All_Of_Doctors,string *field)

{
  __type _Var1;
  ulong uVar2;
  size_type sVar3;
  undefined1 local_50 [40];
  int i;
  string *field_local;
  vector<Doctor,_std::allocator<Doctor>_> *All_Of_Doctors_local;
  Hospital *this_local;
  vector<int,_std::allocator<int>_> *finded;
  
  local_50[0x27] = 0;
  _i = field;
  field_local = (string *)All_Of_Doctors;
  All_Of_Doctors_local = (vector<Doctor,_std::allocator<Doctor>_> *)this;
  this_local = (Hospital *)__return_storage_ptr__;
  std::vector<int,_std::allocator<int>_>::vector(__return_storage_ptr__);
  for (local_50._32_4_ = 0; uVar2 = (ulong)(int)local_50._32_4_,
      sVar3 = std::vector<Doctor,_std::allocator<Doctor>_>::size(All_Of_Doctors), uVar2 < sVar3;
      local_50._32_4_ = local_50._32_4_ + 1) {
    std::vector<Doctor,_std::allocator<Doctor>_>::operator[]
              (All_Of_Doctors,(long)(int)local_50._32_4_);
    Doctor::Field_getter_abi_cxx11_((Doctor *)local_50);
    _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_50,field);
    std::__cxx11::string::~string((string *)local_50);
    if (_Var1) {
      std::vector<int,_std::allocator<int>_>::push_back
                (__return_storage_ptr__,(value_type_conflict *)(local_50 + 0x20));
    }
  }
  return __return_storage_ptr__;
}

Assistant:

vector<int>  Hospital::  Find_Doctor_From_His_Field_vector (vector<Doctor> All_Of_Doctors,string field){
    vector<int> finded ;
    for (int i = 0; i <All_Of_Doctors.size() ; ++i) {
        if (All_Of_Doctors[i].Field_getter() == field){
            finded.push_back(i);
        }
    }
    return finded;
}